

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gflags.cc
# Opt level: O1

int32 google::Int32FromEnv(char *v,int32 dflt)

{
  bool bVar1;
  char *__s;
  void *valbuf;
  FlagValue ifv;
  string valstr;
  FlagValue local_50;
  char *local_40;
  undefined8 local_38;
  char local_30 [16];
  
  local_38 = 0;
  local_30[0] = '\0';
  local_40 = local_30;
  __s = getenv(v);
  if (__s != (char *)0x0) {
    strlen(__s);
    std::__cxx11::string::_M_replace((ulong)&local_40,0,(char *)0x0,(ulong)__s);
    valbuf = operator_new(4);
    anon_unknown_1::FlagValue::FlagValue(&local_50,valbuf,"int32",true);
    bVar1 = anon_unknown_1::FlagValue::ParseFrom(&local_50,local_40);
    if (!bVar1) {
      anon_unknown_1::ReportError
                (DIE,"ERROR: error parsing env variable \'%s\' with value \'%s\'\n",v,local_40);
    }
    dflt = *local_50.value_buffer_;
    anon_unknown_1::FlagValue::~FlagValue(&local_50);
  }
  if (local_40 != local_30) {
    operator_delete(local_40);
  }
  return dflt;
}

Assistant:

int32 Int32FromEnv(const char *v, int32 dflt) {
  return GetFromEnv(v, "int32", dflt);
}